

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O3

slab * slab_get_with_order(slab_cache *cache,uint8_t order)

{
  slab *slab;
  small_stats *psVar1;
  size_t *psVar2;
  rlist *shift;
  rlist *prVar3;
  uint8_t uVar4;
  byte bVar5;
  uint uVar6;
  rlist *prVar7;
  rlist *prVar8;
  rlist *prVar9;
  long lVar10;
  ulong uVar11;
  
  bVar5 = cache->order_max;
  if (bVar5 < order) {
    __assert_fail("order <= cache->order_max",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0xe0,"struct slab *slab_get_with_order(struct slab_cache *, uint8_t)");
  }
  prVar7 = &cache->orders[order].slabs;
  prVar3 = cache->orders[order].slabs.next;
  if ((prVar3 == prVar7) && (prVar3 == cache->orders[order].slabs.prev)) {
    prVar9 = &cache->orders[bVar5].slabs;
    lVar10 = (ulong)order * -0x20 + -0x30;
    do {
      if ((ulong)bVar5 * 0x20 + lVar10 == -0x30) {
        prVar7 = (rlist *)slab_map(cache->arena);
        if (prVar7 == (rlist *)0x0) {
          return (slab *)0x0;
        }
        uVar4 = cache->order_max;
        prVar8 = (rlist *)(ulong)cache->arena->slab_size;
        *(undefined4 *)&prVar7[2].next = 0xeec0ffee;
        *(uint8_t *)((long)&prVar7[2].next + 4) = uVar4;
        *(undefined1 *)((long)&prVar7[2].next + 5) = 0;
        prVar7[2].prev = prVar8;
        memset(prVar7 + 3,0x50,(size_t)(prVar8 + -3));
        prVar7->prev = &(cache->allocated).slabs;
        prVar7->next = (cache->allocated).slabs.next;
        (cache->allocated).slabs.next = prVar7;
        prVar7->next->prev = prVar7;
        psVar2 = &(cache->allocated).stats.total;
        *psVar2 = (long)&prVar8->prev + *psVar2;
        prVar3 = prVar7 + 1;
        prVar7[1].prev = prVar9;
        prVar7[1].next = prVar9->next;
        prVar9->next = prVar3;
        (prVar7[1].next)->prev = prVar3;
        prVar9[1].next = (rlist *)((long)&(prVar9[1].next)->prev + (long)prVar8);
        prVar7 = prVar9;
        goto LAB_001030f9;
      }
      prVar3 = (((slab_list *)(prVar7 + 2))->slabs).next;
      lVar10 = lVar10 + -0x20;
    } while ((prVar3 == prVar7 + 2) &&
            (prVar8 = prVar7 + 2, prVar7 = prVar7 + 2, prVar3 == prVar8->prev));
    prVar7 = (rlist *)((long)cache - lVar10);
  }
LAB_001030f9:
  prVar9 = prVar3->next;
  prVar7->next = prVar9;
  prVar9->prev = prVar7;
  prVar3->prev = prVar3;
  prVar3->next = prVar3;
  slab = (slab *)(prVar3 + -1);
  uVar4 = *(uint8_t *)((long)&prVar3[1].next + 4);
  prVar9 = prVar3[1].prev;
  if (uVar4 != order) {
    prVar7[1].next = (rlist *)((long)prVar7[1].next - (long)prVar9);
    do {
      if (uVar4 == '\0') {
        __assert_fail("slab->order > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                      ,0x8d,"struct slab *slab_split(struct slab_cache *, struct slab *)");
      }
      bVar5 = uVar4 - 1;
      if (cache->order_max < bVar5) {
        __assert_fail("order <= cache->order_max",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/slab_cache.h"
                      ,0xee,"intptr_t slab_order_size(struct slab_cache *, uint8_t)");
      }
      uVar6 = *(int *)&cache->order0_size_lb + (uint)bVar5;
      prVar7 = (rlist *)(1L << ((byte)uVar6 & 0x3f));
      *(undefined4 *)&prVar3[1].next = 0xeec0ffee;
      *(byte *)((long)&prVar3[1].next + 4) = bVar5;
      *(undefined1 *)((long)&prVar3[1].next + 5) = 0;
      prVar3[1].prev = prVar7;
      uVar11 = (ulong)slab ^ 1L << ((ulong)uVar6 & 0x3f);
      *(undefined4 *)(uVar11 + 0x28) = 0xeec0ffee;
      *(byte *)(uVar11 + 0x2c) = bVar5;
      *(undefined1 *)(uVar11 + 0x2d) = 0;
      *(rlist **)(uVar11 + 0x20) = prVar7;
      *(slab_list **)(uVar11 + 0x10) = cache->orders + bVar5;
      *(rlist **)(uVar11 + 0x18) = cache->orders[bVar5].slabs.next;
      cache->orders[bVar5].slabs.next = (rlist *)(uVar11 + 0x10);
      **(long **)(uVar11 + 0x18) = (long)(uVar11 + 0x10);
      psVar2 = &cache->orders[bVar5].stats.total;
      *psVar2 = (long)&prVar7->prev + *psVar2;
      uVar4 = *(uint8_t *)((long)&prVar3[1].next + 4);
    } while (uVar4 != order);
    prVar9 = prVar3[1].prev;
    psVar2 = &cache->orders[order].stats.total;
    *psVar2 = (long)&prVar9->prev + *psVar2;
  }
  psVar1 = &(cache->allocated).stats;
  psVar1->used = (long)&prVar9->prev + psVar1->used;
  psVar1 = &cache->orders[order].stats;
  psVar1->used = (long)&prVar9->prev + psVar1->used;
  *(uint8_t *)((long)&prVar3[1].next + 5) = order + '\x01';
  slab_assert(cache,slab);
  return slab;
}

Assistant:

struct slab *
slab_get_with_order(struct slab_cache *cache, uint8_t order)
{
	assert(order <= cache->order_max);
	struct slab *slab;
	/* Search for the first available slab. If a slab
	 * of a bigger size is found, it can be split.
	 * If cache->order_max is reached and there are no
	 * free slabs, allocate a new one on arena.
	 */
	struct slab_list *list= &cache->orders[order];

	for ( ; rlist_empty(&list->slabs); list++) {
		if (list == cache->orders + cache->order_max) {
			slab = slab_map(cache->arena);
			if (slab == NULL)
				return NULL;
			slab_create(slab, cache->order_max,
				    cache->arena->slab_size);
			slab_poison(slab);
			slab_list_add(&cache->allocated, slab,
				      next_in_cache);
			slab_list_add(list, slab, next_in_list);
			break;
		}
	}
	slab = rlist_shift_entry(&list->slabs, struct slab, next_in_list);
	if (slab->order != order) {
		/*
		 * Do not "bill" the size of this slab to this
		 * order, to prevent double accounting of the
		 * same memory.
		 */
		list->stats.total -= slab->size;
		/* Get a slab of the right order. */
		do {
			slab = slab_split(cache, slab);
		} while (slab->order != order);
		/*
		 * Count the slab in this order. The buddy is
		 * already taken care of by slab_split.
		 */
		cache->orders[slab->order].stats.total += slab->size;
	}
	slab_set_used(cache, slab);
	slab_assert(cache, slab);
	return slab;
}